

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ConditionalPathDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ConditionalPathDeclarationSyntax *this,size_t index
          )

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *node;
  PathDeclarationSyntax *node_00;
  SyntaxNode *local_70;
  size_t index_local;
  ConditionalPathDeclarationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_70 = (SyntaxNode *)0x0;
    if (this != (ConditionalPathDeclarationSyntax *)0xfffffffffffffff0) {
      local_70 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 1:
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    token_00.kind = (this->openParen).kind;
    token_00._2_1_ = (this->openParen).field_0x2;
    token_00.numFlags.raw = (this->openParen).numFlags.raw;
    token_00.rawLen = (this->openParen).rawLen;
    token_00.info = (this->openParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->predicate)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 4:
    token_01.kind = (this->closeParen).kind;
    token_01._2_1_ = (this->closeParen).field_0x2;
    token_01.numFlags.raw = (this->closeParen).numFlags.raw;
    token_01.rawLen = (this->closeParen).rawLen;
    token_01.info = (this->closeParen).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 5:
    node_00 = not_null<slang::syntax::PathDeclarationSyntax_*>::get(&this->path);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node_00);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ConditionalPathDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return openParen;
        case 3: return predicate.get();
        case 4: return closeParen;
        case 5: return path.get();
        default: return nullptr;
    }
}